

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int in_R8D;
  vector<int,_std::allocator<int>_> local_2b8;
  _InputArray local_298;
  Mat local_280 [96];
  undefined1 local_220 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> smiles;
  _InputArray local_1f0;
  _InputArray local_1d8;
  _InputArray local_1c0;
  Mat local_1a8 [8];
  Mat image_gray;
  string local_148 [8];
  Mat img;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string img_name;
  int local_60;
  int i;
  allocator<char> local_49;
  string local_48 [8];
  string smile_name;
  char *dir_name;
  char *video_name;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    help();
    argv_local._4_4_ = 0;
  }
  else {
    smile_name.field_2._8_8_ = anon_var_dwarf_5404;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"smile.png",&local_49);
    std::allocator<char>::~allocator(&local_49);
    iVar3 = download(argv[1],"video.mp4");
    if (iVar3 == -1) {
      if ((print_level & 4U) != 0) {
        printf("[%s][%s(%d)]:Download video error.\n","MSG_ERROR","main",0x34);
      }
      if ((print_level & 2U) != 0) {
        printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",0x35);
      }
      argv_local._4_4_ = -1;
    }
    else {
      if ((print_level & 2U) != 0) {
        printf("[%s][%s(%d)]:Download video successful!\n","MSG_INFO","main");
      }
      iVar3 = __mkdir__((char *)smile_name.field_2._8_8_);
      if (iVar3 == -1) {
        if ((print_level & 4U) != 0) {
          printf("[%s][%s(%d)]:Create dir error!\n","MSG_ERROR","main",0x3b);
        }
        if ((print_level & 2U) != 0) {
          printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",0x3c);
        }
        argv_local._4_4_ = -1;
      }
      else {
        if ((print_level & 2U) != 0) {
          printf("[%s][%s(%d)]:Create dir successful!\n","MSG_INFO","main");
        }
        iVar3 = video_to_image("video.mp4",(char *)smile_name.field_2._8_8_);
        if (iVar3 == -1) {
          if ((print_level & 4U) != 0) {
            printf("[%s][%s(%d)]:Video file conversion error!\n","MSG_ERROR","main",0x42);
          }
          if ((print_level & 2U) != 0) {
            printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",0x43);
          }
          argv_local._4_4_ = -1;
        }
        else {
          if ((print_level & 2U) != 0) {
            printf("[%s][%s(%d)]:Video convert image successful!\n","MSG_INFO","main");
          }
          for (img_name.field_2._12_4_ = 1; (int)img_name.field_2._12_4_ < 9999;
              img_name.field_2._12_4_ = img_name.field_2._12_4_ + 1) {
            std::operator+(&local_c8,(char *)smile_name.field_2._8_8_,&forward_slash_abi_cxx11_);
            std::__cxx11::to_string(&local_e8,img_name.field_2._12_4_);
            std::operator+(&local_a8,&local_c8,&local_e8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,&local_a8,&suffix_png_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_c8);
            cv::imread(local_148,(int)local_88);
            bVar1 = cv::Mat::empty();
            if ((bVar1 & 1) == 0) {
              cv::Mat::Mat(local_1a8);
              cv::_InputArray::_InputArray(&local_1c0,(Mat *)local_148);
              cv::_OutputArray::_OutputArray((_OutputArray *)&local_1d8,local_1a8);
              cv::cvtColor((cv *)&local_1c0,&local_1d8,(_OutputArray *)0x6,0,in_R8D);
              cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1d8);
              cv::_InputArray::~_InputArray(&local_1c0);
              cv::_InputArray::_InputArray(&local_1f0,local_1a8);
              cv::_OutputArray::_OutputArray
                        ((_OutputArray *)
                         &smiles.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_1a8);
              cv::equalizeHist(&local_1f0,
                               (_OutputArray *)
                               &smiles.
                                super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cv::_OutputArray::~_OutputArray
                        ((_OutputArray *)
                         &smiles.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              cv::_InputArray::~_InputArray(&local_1f0);
              cv::Mat::Mat(local_280,local_1a8);
              detectSmile((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_220,
                          local_280);
              cv::Mat::~Mat(local_280);
              bVar2 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::empty
                                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                 local_220);
              if (!bVar2) {
                cv::_InputArray::_InputArray(&local_298,(Mat *)local_148);
                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<int,_std::allocator<int>_>::vector(&local_2b8);
                cv::imwrite(local_48,&local_298,(vector *)&local_2b8);
                std::vector<int,_std::allocator<int>_>::~vector(&local_2b8);
                cv::_InputArray::~_InputArray(&local_298);
              }
              std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_220);
              cv::Mat::~Mat(local_1a8);
              local_60 = 0;
            }
            else {
              local_60 = 0x14;
            }
            cv::Mat::~Mat((Mat *)local_148);
            std::__cxx11::string::~string((string *)local_88);
            if (local_60 != 0) break;
          }
          if ((print_level & 2U) != 0) {
            printf("[%s][%s(%d)]:Smile detector successful!\n","MSG_INFO","main",0x58);
          }
          iVar3 = __rmdir__((char *)smile_name.field_2._8_8_);
          if (iVar3 == -1) {
            if ((print_level & 4U) != 0) {
              printf("[%s][%s(%d)]:Delete temp dir error.\n","MSG_ERROR","main",0x5b);
            }
            if ((print_level & 2U) != 0) {
              printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",0x5c);
            }
            argv_local._4_4_ = -1;
          }
          else {
            if ((print_level & 2U) != 0) {
              printf("[%s][%s(%d)]:Delete temp dir successful!\n","MSG_INFO","main",0x5f);
            }
            argv_local._4_4_ = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[]) {
  if (argc < 2) {
    help();
    return 0;
  }
  const char *video_name = "video.mp4";
  const char *dir_name = "./video";
  string smile_name = "smile.png";
  if (download(argv[1], video_name) == -1) {
    lprintf(MSG_ERROR, "Download video error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Download video successful!\n");

  if (__mkdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Create dir error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Create dir successful!\n");

  if (video_to_image(video_name, dir_name) == -1) {
    lprintf(MSG_ERROR, "Video file conversion error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Video convert image successful!\n");

  // Read the image, convert it into gray image, and then equalize the
  // histogram.
  for (int i = 1; i < 9999; i++) {
    string img_name = dir_name + forward_slash + to_string(i) + suffix_png;

    Mat img = imread(img_name);
    if (img.empty()) break;

    Mat image_gray;
    cvtColor(img, image_gray, COLOR_BGR2GRAY);
    equalizeHist(image_gray, image_gray);

    vector<Rect> smiles = detectSmile(image_gray);

    if (!smiles.empty()) imwrite(smile_name, img);
  }
  lprintf(MSG_INFO, "Smile detector successful!\n");

  if (__rmdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Delete temp dir error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Delete temp dir successful!\n");

  return 0;
}